

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmakecl.cpp
# Opt level: O0

char * make_opt_file_relative
                 (char *buf,size_t buflen,int read_opt_file,char *opt_file_path,char *fname)

{
  int iVar1;
  int in_EDX;
  char *in_RSI;
  char *in_RDI;
  char *in_R8;
  char lcl [4096];
  char *path;
  size_t in_stack_ffffffffffffefc8;
  char *in_stack_ffffffffffffefd0;
  size_t in_stack_ffffffffffffefd8;
  char *in_stack_ffffffffffffefe0;
  undefined8 local_8;
  
  local_8 = in_R8;
  if (in_EDX != 0) {
    if ((char *)0xfff < in_RSI) {
      in_RSI = (char *)0x1000;
    }
    path = in_RDI;
    os_cvt_url_dir(in_RDI,(size_t)in_RSI,in_R8);
    iVar1 = os_is_file_absolute(in_RSI);
    local_8 = in_RDI;
    if (iVar1 == 0) {
      lib_strcpy(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8,in_stack_ffffffffffffefd0);
      os_build_full_path(in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,path,in_RSI);
    }
  }
  return local_8;
}

Assistant:

static char *make_opt_file_relative(char *buf, size_t buflen,
                                    int read_opt_file,
                                    const char *opt_file_path,
                                    char *fname)
{
    /* 
     *   if we haven't read an option file, we don't have an option file path
     *   to use as the relative root, so use the original filename unchanged 
     */
    if (!read_opt_file)
        return fname;

    /* convert the name to local conventions */
    char lcl[OSFNMAX];
    os_cvt_url_dir(buf, buflen < sizeof(lcl) ? buflen : sizeof(lcl), fname);

    /* if the filename is absolute, use it as given */
    if (os_is_file_absolute(buf))
        return buf;

    /* 
     *   we have a relative filename and an option file, so build the given
     *   name relative to the option file path, using the version that we
     *   converted to local conventions 
     */
    lib_strcpy(lcl, sizeof(lcl), buf);
    os_build_full_path(buf, buflen, opt_file_path, lcl);

    /* return the caller's buffer where we built the full path */
    return buf;
}